

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O0

int ngp_get_extver(char *extname,int *version)

{
  int iVar1;
  size_t sVar2;
  char *__dest;
  int *in_RSI;
  char *in_RDI;
  int i;
  char *p2;
  NGP_EXTVER_TAB *p;
  int local_2c;
  NGP_EXTVER_TAB *local_20;
  int local_4;
  
  if ((in_RDI == (char *)0x0) || (in_RSI == (int *)0x0)) {
    local_4 = 0x170;
  }
  else if ((ngp_extver_tab == (NGP_EXTVER_TAB *)0x0) && (0 < ngp_extver_tab_size)) {
    local_4 = 0x170;
  }
  else if ((ngp_extver_tab == (NGP_EXTVER_TAB *)0x0) || (0 < ngp_extver_tab_size)) {
    for (local_2c = 0; local_2c < ngp_extver_tab_size; local_2c = local_2c + 1) {
      iVar1 = strcmp(in_RDI,ngp_extver_tab[local_2c].extname);
      if (iVar1 == 0) {
        iVar1 = ngp_extver_tab[local_2c].version + 1;
        ngp_extver_tab[local_2c].version = iVar1;
        *in_RSI = iVar1;
        return 0;
      }
    }
    if (ngp_extver_tab == (NGP_EXTVER_TAB *)0x0) {
      local_20 = (NGP_EXTVER_TAB *)malloc(0x10);
    }
    else {
      local_20 = (NGP_EXTVER_TAB *)realloc(ngp_extver_tab,(long)(ngp_extver_tab_size + 1) << 4);
    }
    if (local_20 == (NGP_EXTVER_TAB *)0x0) {
      local_4 = 0x168;
    }
    else {
      sVar2 = strlen(in_RDI);
      __dest = (char *)malloc(sVar2 + 1);
      if (__dest == (char *)0x0) {
        free(local_20);
        local_4 = 0x168;
      }
      else {
        strcpy(__dest,in_RDI);
        ngp_extver_tab = local_20;
        local_20[ngp_extver_tab_size].extname = __dest;
        ngp_extver_tab[ngp_extver_tab_size].version = 1;
        *in_RSI = 1;
        ngp_extver_tab_size = ngp_extver_tab_size + 1;
        local_4 = 0;
      }
    }
  }
  else {
    local_4 = 0x170;
  }
  return local_4;
}

Assistant:

int	ngp_get_extver(char *extname, int *version)
 { NGP_EXTVER_TAB *p;
   char 	*p2;
   int		i;

   if ((NULL == extname) || (NULL == version)) return(NGP_BAD_ARG);
   if ((NULL == ngp_extver_tab) && (ngp_extver_tab_size > 0)) return(NGP_BAD_ARG);
   if ((NULL != ngp_extver_tab) && (ngp_extver_tab_size <= 0)) return(NGP_BAD_ARG);

   for (i=0; i<ngp_extver_tab_size; i++)
    { if (0 == strcmp(extname, ngp_extver_tab[i].extname))
        { *version = (++ngp_extver_tab[i].version);
          return(NGP_OK);
        }
    }

   if (NULL == ngp_extver_tab)
     { p = (NGP_EXTVER_TAB *)ngp_alloc(sizeof(NGP_EXTVER_TAB)); }
   else
     { p = (NGP_EXTVER_TAB *)ngp_realloc(ngp_extver_tab, (ngp_extver_tab_size + 1) * sizeof(NGP_EXTVER_TAB)); }

   if (NULL == p) return(NGP_NO_MEMORY);

   p2 = ngp_alloc(strlen(extname) + 1);
   if (NULL == p2)
     { ngp_free(p);
       return(NGP_NO_MEMORY);
     }

   strcpy(p2, extname);
   ngp_extver_tab = p;
   ngp_extver_tab[ngp_extver_tab_size].extname = p2;
   *version = ngp_extver_tab[ngp_extver_tab_size].version = 1;

   ngp_extver_tab_size++;

   return(NGP_OK);
 }